

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O3

void __thiscall
TEST_DoublingFactorCounterTest_ThreeColourStraights_TestShell::
~TEST_DoublingFactorCounterTest_ThreeColourStraights_TestShell
          (TEST_DoublingFactorCounterTest_ThreeColourStraights_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, ThreeColourStraights)
{
	addPair(Tile::WestWind);
	addSequence(Tile::TwoOfCharacters, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);
	addSequence(Tile::SevenOfCharacters, true);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeColourStraights));
	CHECK_EQUAL(1, r.doubling_factor);
}